

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O1

void __thiscall Database::mapSlice(Database *this,int fd,int slice_number)

{
  char *__addr;
  
  __addr = (char *)mmap((void *)0x0,0x2000000,3,1,fd,0);
  if (__addr != (char *)0xffffffffffffffff) {
    madvise(__addr,0x2000000,2);
    this->slices[slice_number] = __addr;
    return;
  }
  __assert_fail("data_mapped != MAP_FAILED",
                "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/database.cc"
                ,0x79,"void Database::mapSlice(int, int)");
}

Assistant:

void Database::mapSlice(int fd, int slice_number) {
    auto data_mapped = mmap(nullptr, SLICE_SIZE, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
    assert(data_mapped != MAP_FAILED);
    madvise(data_mapped, SLICE_SIZE, MADV_SEQUENTIAL);
    slices[slice_number] = (char*) data_mapped;
}